

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

void anon_unknown.dwarf_2fe304::dumpNode(Node *node,uint indent)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  ret_type this;
  KeyValueNode *this_00;
  ret_type this_01;
  Node *pNVar4;
  Node *it_1;
  iterator __end3_1;
  iterator __begin3_1;
  SequenceNode *__range3_1;
  SequenceNode *sequence;
  KeyValueNode *it;
  iterator __end3;
  iterator __begin3;
  MappingNode *__range3;
  MappingNode *map;
  string local_150;
  undefined1 local_130 [8];
  SmallString<256U> storage;
  ScalarNode *scalar;
  uint indent_local;
  Node *node_local;
  
  uVar2 = llvm::yaml::Node::getType(node);
  switch(uVar2) {
  case 0:
    fprintf(_stderr,"%*s(null)\n",(ulong)(indent << 1),"");
    break;
  case 1:
    storage.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
         llvm::cast<llvm::yaml::ScalarNode,llvm::yaml::Node>(node);
    llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_130);
    __stream = _stderr;
    _map = llvm::yaml::ScalarNode::getValue
                     ((ScalarNode *)
                      storage.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                      InlineElts._248_8_,(SmallVectorImpl<char> *)local_130);
    llvm::StringRef::str_abi_cxx11_(&local_150,(StringRef *)&map);
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"%*s(scalar: \'%s\')\n",(ulong)(indent << 1),"",uVar3);
    std::__cxx11::string::~string((string *)&local_150);
    llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_130);
    break;
  default:
    fprintf(_stderr,"%*s<node: %p, unknown>\n",(ulong)(indent << 1),"",node);
    break;
  case 3:
    __assert_fail("0 && \"unexpected keyvalue node\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildFile.cpp"
                  ,0x46,"void (anonymous namespace)::dumpNode(llvm::yaml::Node *, unsigned int)");
  case 4:
    this = llvm::cast<llvm::yaml::MappingNode,llvm::yaml::Node>(node);
    fprintf(_stderr,"%*smap:\n",(ulong)(indent << 1),"");
    __end3 = llvm::yaml::MappingNode::begin(this);
    it = (KeyValueNode *)llvm::yaml::MappingNode::end(this);
    while (bVar1 = llvm::yaml::
                   basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                   operator!=(&__end3,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                       *)&it), bVar1) {
      this_00 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator*(&__end3);
      fprintf(_stderr,"%*skey:\n",(ulong)((indent + 1) * 2),"");
      pNVar4 = llvm::yaml::KeyValueNode::getKey(this_00);
      dumpNode(pNVar4,indent + 2);
      fprintf(_stderr,"%*svalue:\n",(ulong)((indent + 1) * 2),"");
      pNVar4 = llvm::yaml::KeyValueNode::getValue(this_00);
      dumpNode(pNVar4,indent + 2);
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&__end3);
    }
    break;
  case 5:
    this_01 = llvm::cast<llvm::yaml::SequenceNode,llvm::yaml::Node>(node);
    fprintf(_stderr,"%*ssequence:\n",(ulong)(indent << 1),"");
    __end3_1 = llvm::yaml::SequenceNode::begin(this_01);
    it_1 = (Node *)llvm::yaml::SequenceNode::end(this_01);
    while (bVar1 = llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                   ::operator!=(&__end3_1,
                                (basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                 *)&it_1), bVar1) {
      pNVar4 = llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
               operator*(&__end3_1);
      dumpNode(pNVar4,indent + 1);
      llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
                (&__end3_1);
    }
    break;
  case 6:
    fprintf(_stderr,"%*s(alias)\n",(ulong)(indent << 1),"");
  }
  return;
}

Assistant:

static void dumpNode(llvm::yaml::Node* node, unsigned indent) {
  switch (node->getType()) {
  default: {
    fprintf(stderr, "%*s<node: %p, unknown>\n", indent*2, "", node);
    break;
  }

  case llvm::yaml::Node::NK_Null: {
    fprintf(stderr, "%*s(null)\n", indent*2, "");
    break;
  }

  case llvm::yaml::Node::NK_Scalar: {
    llvm::yaml::ScalarNode* scalar = llvm::cast<llvm::yaml::ScalarNode>(node);
    SmallString<256> storage;
    fprintf(stderr, "%*s(scalar: '%s')\n", indent*2, "",
            scalar->getValue(storage).str().c_str());
    break;
  }

  case llvm::yaml::Node::NK_KeyValue: {
    assert(0 && "unexpected keyvalue node");
    break;
  }

  case llvm::yaml::Node::NK_Mapping: {
    llvm::yaml::MappingNode* map = llvm::cast<llvm::yaml::MappingNode>(node);
    fprintf(stderr, "%*smap:\n", indent*2, "");
    for (auto& it: *map) {
      fprintf(stderr, "%*skey:\n", (indent+1)*2, "");
      dumpNode(it.getKey(), indent+2);
      fprintf(stderr, "%*svalue:\n", (indent+1)*2, "");
      dumpNode(it.getValue(), indent+2);
    }
    break;
  }

  case llvm::yaml::Node::NK_Sequence: {
    llvm::yaml::SequenceNode* sequence =
      llvm::cast<llvm::yaml::SequenceNode>(node);
    fprintf(stderr, "%*ssequence:\n", indent*2, "");
    for (auto& it: *sequence) {
      dumpNode(&it, indent+1);
    }
    break;
  }

  case llvm::yaml::Node::NK_Alias: {
    fprintf(stderr, "%*s(alias)\n", indent*2, "");
    break;
  }
  }
}